

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

_GLFWmapping * findValidMapping(_GLFWjoystick *js)

{
  GLFWbool GVar1;
  _GLFWmapping *p_Var2;
  long lVar3;
  char *format;
  
  p_Var2 = findMapping(js->guid);
  if (p_Var2 != (_GLFWmapping *)0x0) {
    lVar3 = 0xa1;
    format = "Invalid button in gamepad mapping %s (%s)";
    do {
      GVar1 = isValidElementForJoystick((_GLFWmapelement *)(p_Var2->name + lVar3),js);
      if (GVar1 == 0) goto LAB_0032a779;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0xdd);
    lVar3 = 0xdd;
    format = "Invalid axis in gamepad mapping %s (%s)";
    while (GVar1 = isValidElementForJoystick((_GLFWmapelement *)(p_Var2->name + lVar3),js),
          GVar1 != 0) {
      lVar3 = lVar3 + 4;
      if (lVar3 == 0xf5) {
        return p_Var2;
      }
    }
LAB_0032a779:
    _glfwInputError(0x10004,format,p_Var2->guid,p_Var2);
  }
  return (_GLFWmapping *)0x0;
}

Assistant:

static _GLFWmapping* findValidMapping(const _GLFWjoystick* js)
{
    _GLFWmapping* mapping = findMapping(js->guid);
    if (mapping)
    {
        int i;

        for (i = 0;  i <= GLFW_GAMEPAD_BUTTON_LAST;  i++)
        {
            if (!isValidElementForJoystick(mapping->buttons + i, js))
            {
                _glfwInputError(GLFW_INVALID_VALUE,
                                "Invalid button in gamepad mapping %s (%s)",
                                mapping->guid,
                                mapping->name);
                return NULL;
            }
        }

        for (i = 0;  i <= GLFW_GAMEPAD_AXIS_LAST;  i++)
        {
            if (!isValidElementForJoystick(mapping->axes + i, js))
            {
                _glfwInputError(GLFW_INVALID_VALUE,
                                "Invalid axis in gamepad mapping %s (%s)",
                                mapping->guid,
                                mapping->name);
                return NULL;
            }
        }
    }

    return mapping;
}